

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

void __thiscall WorldShuffler::open_random_blocked_path(WorldShuffler *this)

{
  WorldPath *path;
  Item *item;
  Json *this_00;
  reference pvVar1;
  mapped_type_conflict2 *pmVar2;
  ItemSource *pIVar3;
  WorldSolver *this_01;
  initializer_list_t init;
  ItemSource *source;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> weighted_blocked_paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pointer local_a0;
  pointer local_98;
  vector<ItemSource*,std::allocator<ItemSource*>> *local_90;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  *local_88;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  _Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_> local_60;
  _Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_> local_48;
  
  this_01 = &this->_solver;
  this_00 = WorldSolver::debug_log_for_current_step_abi_cxx11_(this_01);
  init._M_len = 0;
  init._M_array = (iterator)&local_80;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::array(init);
  pvVar1 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this_00,"blockedPaths");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar1,&local_80);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_80);
  build_weighted_blocked_paths_list
            ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)&local_60,this);
  if (local_60._M_impl.super__Vector_impl_data._M_start !=
      local_60._M_impl.super__Vector_impl_data._M_finish) {
    path = *local_60._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_00,"chosenPath");
    std::operator+(&local_e0,&path->_from_node->_id," --> ");
    std::operator+(&local_c0,&local_e0,&path->_to_node->_id);
    nlohmann::
    basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::emplace_back<std::__cxx11::string>
              ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)pvVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    WorldSolver::missing_items_to_take_path
              ((vector<Item_*,_std::allocator<Item_*>_> *)&local_c0,this_01,path);
    local_a0 = (pointer)local_c0._M_string_length;
    local_88 = &this->_item_pool_quantities;
    local_90 = (vector<ItemSource*,std::allocator<ItemSource*>> *)&this->_logical_playthrough;
    while (local_c0._M_dataplus._M_p != local_a0) {
      item = *(Item **)local_c0._M_dataplus._M_p;
      local_98 = local_c0._M_dataplus._M_p;
      while( true ) {
        local_e0._M_dataplus._M_p._0_1_ = item->_id;
        pmVar2 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::operator[](local_88,(key_type_conflict *)&local_e0);
        if (*pmVar2 == 0) break;
        WorldSolver::empty_reachable_item_sources
                  ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_48,this_01);
        pIVar3 = place_item_randomly(this,item,
                                     (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)
                                     &local_48);
        std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base(&local_48);
        local_e0._M_dataplus._M_p = (pointer)pIVar3;
        std::vector<ItemSource*,std::allocator<ItemSource*>>::emplace_back<ItemSource*&>
                  (local_90,(ItemSource **)&local_e0);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_70,&item->_name);
        pvVar1 = nlohmann::
                 basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_00,"placedKeyItems");
        pvVar1 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](pvVar1,(key_type *)(local_e0._M_dataplus._M_p + 8));
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(pvVar1,&local_70);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_70);
      }
      local_c0._M_dataplus._M_p = local_98 + 8;
    }
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base
              ((_Vector_base<Item_*,_std::allocator<Item_*>_> *)&local_c0);
  }
  std::_Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void WorldShuffler::open_random_blocked_path()
{
    Json& debug_log = _solver.debug_log_for_current_step();
    debug_log["blockedPaths"] = Json::array();

    // List all blocked paths, taking weights into account and randomly choose one
    std::vector<WorldPath*> weighted_blocked_paths = this->build_weighted_blocked_paths_list();
    if (weighted_blocked_paths.empty())
        return;
    WorldPath* path_to_open = weighted_blocked_paths[0];
    debug_log["chosenPath"].emplace_back(path_to_open->origin()->id() + " --> " + path_to_open->destination()->id());

    // Place all missing key items for the player to be able to open this blocking path
    std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path_to_open);
    for(Item* item : items_to_place)
    {
        while(_item_pool_quantities[item->id()] > 0)
        {
            ItemSource* source = this->place_item_randomly(item, _solver.empty_reachable_item_sources());
            _logical_playthrough.emplace_back(source);
            debug_log["placedKeyItems"][source->name()] = item->name();
        }
    }
}